

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

size_t EmitArgsWithArgOutsAtEnd
                 (ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
                 FuncInfo *funcInfo,ProfileId callSiteId,RegSlot thisLocation,
                 ArgSlot argsCountForStartCall,bool emitProfiledArgouts,
                 AuxArray<unsigned_int> *spreadIndices)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  RegSlot argTempLocation;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ulong uVar6;
  RegSlot reg;
  uint uVar7;
  ProfileId callSiteId_00;
  undefined6 in_register_00000082;
  ArgSlot AVar8;
  ByteCodeWriter *this;
  uint local_40;
  ArgSlot local_38 [2];
  uint local_34;
  ArgSlot argIndex;
  ArgSlot spreadIndex;
  
  uVar7 = (uint)CONCAT62(in_register_00000082,callSiteId);
  if (pnode == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    local_34 = uVar7;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d3a,"(pnode != nullptr)","pnode != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar7 = local_34;
  }
  local_38[0] = 0;
  local_38[1] = 0;
  RVar3 = FuncInfo::AcquireTmpRegister(funcInfo);
  local_34 = uVar7 & 0xffff;
  argTempLocation = RVar3;
  while (pnode->nop == knopList) {
    pPVar5 = ParseNode::AsParseNodeBin(pnode);
    EmitOneArg(pPVar5->pnode1,fAssignRegs,byteCodeGenerator,funcInfo,(ProfileId)local_34,local_38,
               local_38 + 1,argTempLocation,false,spreadIndices);
    pPVar5 = ParseNode::AsParseNodeBin(pnode);
    pnode = pPVar5->pnode2;
    argTempLocation = FuncInfo::AcquireTmpRegister(funcInfo);
  }
  callSiteId_00 = (ProfileId)local_34;
  EmitOneArg(pnode,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId_00,local_38,local_38 + 1,
             argTempLocation,false,spreadIndices);
  this = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::StartCall(this,StartCall,argsCountForStartCall);
  if (thisLocation != 0xffffffff) {
    Js::ByteCodeWriter::ArgOut<true>(this,0,thisLocation,callSiteId_00,false);
  }
  AVar8 = local_38[0];
  uVar6 = (ulong)local_38[0];
  uVar7 = 0;
  while (local_40 = (uint)AVar8, local_40 != uVar7) {
    reg = RVar3 + uVar7;
    uVar7 = uVar7 + 1;
    Js::ByteCodeWriter::ArgOut<true>
              (this,(ArgSlot)uVar7,reg,(ProfileId)local_34,emitProfiledArgouts);
  }
  while (bVar2 = AVar8 != 0, AVar8 = AVar8 - 1, bVar2) {
    FuncInfo::ReleaseTmpRegister(funcInfo,argTempLocation);
    argTempLocation = argTempLocation - 1;
  }
  return uVar6;
}

Assistant:

size_t EmitArgsWithArgOutsAtEnd(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::RegSlot thisLocation,
    Js::ArgSlot argsCountForStartCall,
    bool emitProfiledArgouts,
    Js::AuxArray<uint32> *spreadIndices = nullptr
)
{
    AssertOrFailFast(pnode != nullptr);

    Js::ArgSlot argIndex = 0;
    Js::ArgSlot spreadIndex = 0;

    Js::RegSlot argTempLocation = funcInfo->AcquireTmpRegister();
    Js::RegSlot firstArgTempLocation = argTempLocation;

    while (pnode->nop == knopList)
    {
        EmitOneArg(pnode->AsParseNodeBin()->pnode1, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);
        pnode = pnode->AsParseNodeBin()->pnode2;
        argTempLocation = funcInfo->AcquireTmpRegister();
    }

    EmitOneArg(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argsCountForStartCall);

    // Emit all argOuts now

    if (thisLocation != Js::Constants::NoRegister)
    {
        // Emit the "this" object.
        byteCodeGenerator->Writer()->ArgOut<true>(0, thisLocation, callSiteId, false /*emitProfiledArgouts*/);
    }

    for (Js::ArgSlot index = 0; index < argIndex; index++)
    {
        byteCodeGenerator->Writer()->ArgOut<true>(index + 1, firstArgTempLocation + index, callSiteId, emitProfiledArgouts);
    }

    // Now release all those temps register
    for (Js::ArgSlot index = argIndex; index > 0; index--)
    {
        funcInfo->ReleaseTmpRegister(argTempLocation--);
    }

    return argIndex;
}